

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

NameIndex * __thiscall
llvm::DWARFDebugNames::getCUNameIndex(DWARFDebugNames *this,uint64_t CUOffset)

{
  NameIndex *pNVar1;
  uint32_t CU;
  uint uVar2;
  pair<llvm::DenseMapIterator<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>,_false>,_bool>
  local_68;
  uint64_t local_50;
  uint64_t CUOffset_local;
  NameIndex *local_40;
  NameIndex *local_38;
  
  uVar2 = (this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
          super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
          super_SmallVectorBase.Size;
  local_50 = CUOffset;
  if (uVar2 != 0 && (this->CUToNameIndex).NumEntries == 0) {
    pNVar1 = (NameIndex *)
             (this->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
             super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>.
             super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.
             super_SmallVectorBase.BeginX;
    local_38 = pNVar1 + uVar2;
    for (; pNVar1 != local_38; pNVar1 = pNVar1 + 1) {
      for (uVar2 = 0; uVar2 < (pNVar1->Hdr).super_HeaderPOD.CompUnitCount; uVar2 = uVar2 + 1) {
        CUOffset_local = NameIndex::getCUOffset(pNVar1,uVar2);
        local_40 = pNVar1;
        DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
        ::try_emplace<llvm::DWARFDebugNames::NameIndex_const*>
                  (&local_68,
                   (DenseMapBase<llvm::DenseMap<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>,unsigned_long,llvm::DWARFDebugNames::NameIndex_const*,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,llvm::DWARFDebugNames::NameIndex_const*>>
                    *)&this->CUToNameIndex,&CUOffset_local,&local_40);
      }
    }
  }
  pNVar1 = DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
           ::lookup((DenseMapBase<llvm::DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>,_unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
                     *)&this->CUToNameIndex,&local_50);
  return pNVar1;
}

Assistant:

const DWARFDebugNames::NameIndex *
DWARFDebugNames::getCUNameIndex(uint64_t CUOffset) {
  if (CUToNameIndex.size() == 0 && NameIndices.size() > 0) {
    for (const auto &NI : *this) {
      for (uint32_t CU = 0; CU < NI.getCUCount(); ++CU)
        CUToNameIndex.try_emplace(NI.getCUOffset(CU), &NI);
    }
  }
  return CUToNameIndex.lookup(CUOffset);
}